

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayout::timerEvent(QMainWindowLayout *this,QTimerEvent *e)

{
  int iVar1;
  int iVar2;
  QTimerEvent *in_RDI;
  pointer in_stack_ffffffffffffffd8;
  
  iVar1 = QTimerEvent::timerId((QTimerEvent *)0x5f9316);
  iVar2 = QBasicTimer::timerId((QBasicTimer *)0x5f932b);
  if (iVar1 == iVar2) {
    QBasicTimer::stop();
    std::unique_ptr<QMainWindowLayoutState,_std::default_delete<QMainWindowLayoutState>_>::reset
              ((unique_ptr<QMainWindowLayoutState,_std::default_delete<QMainWindowLayoutState>_> *)
               in_RDI,in_stack_ffffffffffffffd8);
  }
  QObject::timerEvent(in_RDI);
  return;
}

Assistant:

void QMainWindowLayout::timerEvent(QTimerEvent *e)
{
    if (e->timerId() == discardRestoredStateTimer.timerId()) {
        discardRestoredStateTimer.stop();
        restoredState.reset();
    }
    QLayout::timerEvent(e);
}